

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_generated.h
# Opt level: O0

Offset<MyGame::Sample::Monster>
MyGame::Sample::CreateMonster
          (FlatBufferBuilder *_fbb,Vec3 *pos,int16_t mana,int16_t hp,
          Offset<flatbuffers::String> name,Offset<flatbuffers::Vector<unsigned_char>_> inventory,
          int8_t color)

{
  Offset<MyGame::Sample::Monster> OVar1;
  undefined1 local_40 [8];
  MonsterBuilder builder_;
  int16_t hp_local;
  int16_t mana_local;
  Vec3 *pos_local;
  FlatBufferBuilder *_fbb_local;
  Offset<flatbuffers::Vector<unsigned_char>_> inventory_local;
  Offset<flatbuffers::String> name_local;
  
  builder_._12_2_ = hp;
  builder_._14_2_ = mana;
  MonsterBuilder::MonsterBuilder((MonsterBuilder *)local_40,_fbb);
  MonsterBuilder::add_inventory((MonsterBuilder *)local_40,inventory);
  MonsterBuilder::add_name((MonsterBuilder *)local_40,name);
  MonsterBuilder::add_pos((MonsterBuilder *)local_40,pos);
  MonsterBuilder::add_hp((MonsterBuilder *)local_40,builder_._12_2_);
  MonsterBuilder::add_mana((MonsterBuilder *)local_40,builder_._14_2_);
  MonsterBuilder::add_color((MonsterBuilder *)local_40,color);
  OVar1 = MonsterBuilder::Finish((MonsterBuilder *)local_40);
  return (Offset<MyGame::Sample::Monster>)OVar1.o;
}

Assistant:

inline flatbuffers::Offset<Monster> CreateMonster(flatbuffers::FlatBufferBuilder &_fbb, const Vec3 *pos, int16_t mana, int16_t hp, flatbuffers::Offset<flatbuffers::String> name, flatbuffers::Offset<flatbuffers::Vector<uint8_t>> inventory, int8_t color) {
  MonsterBuilder builder_(_fbb);
  builder_.add_inventory(inventory);
  builder_.add_name(name);
  builder_.add_pos(pos);
  builder_.add_hp(hp);
  builder_.add_mana(mana);
  builder_.add_color(color);
  return builder_.Finish();
}